

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::RawBufferAsyncModificationRegister_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContextTTD *this;
  ScriptContext *pSVar1;
  JsRTRawBufferModifyAction *pJVar2;
  Var aValue;
  ArrayBuffer *trgt_00;
  Var trgt;
  JsRTRawBufferModifyAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  pSVar1 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar1 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)64>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar2->Trgt);
  this = pSVar1->TTDContextInfo;
  trgt_00 = Js::VarTo<Js::ArrayBuffer>(aValue);
  ScriptContextTTD::AddToAsyncPendingList(this,trgt_00,pJVar2->Index);
  return;
}

Assistant:

void RawBufferAsyncModificationRegister_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferAsyncModificationRegister>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            ctx->TTDContextInfo->AddToAsyncPendingList(Js::VarTo<Js::ArrayBuffer>(trgt), action->Index);
        }